

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_slope.hpp
# Opt level: O2

void duckdb::RegrSlopeOperation::Finalize<double,duckdb::RegrSlopeState>
               (RegrSlopeState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  OutOfRangeException *this;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  allocator local_51;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  string local_38;
  
  uVar1 = (state->cov_pop).count;
  if ((uVar1 == 0) || (uVar2 = (state->var_pop).count, uVar2 == 0)) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  local_50 = 0.0;
  if (uVar2 != 1) {
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    local_50 = (state->var_pop).dsquared /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  local_48 = (state->cov_pop).co_moment;
  uStack_40 = 0;
  bVar3 = Value::DoubleIsFinite(local_50);
  if (bVar3) {
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    *target = (double)(~-(ulong)(local_50 != 0.0) & 0x7ff8000000000000 |
                      (ulong)((local_48 /
                              ((auVar4._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) /
                             local_50) & -(ulong)(local_50 != 0.0));
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"VARPOP is out of range!",&local_51);
  OutOfRangeException::OutOfRangeException(this,&local_38);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.cov_pop.count == 0 || state.var_pop.count == 0) {
			finalize_data.ReturnNull();
		} else {
			auto cov = state.cov_pop.co_moment / state.cov_pop.count;
			auto var_pop = state.var_pop.count > 1 ? (state.var_pop.dsquared / state.var_pop.count) : 0;
			if (!Value::DoubleIsFinite(var_pop)) {
				throw OutOfRangeException("VARPOP is out of range!");
			}
			target = var_pop != 0 ? cov / var_pop : NAN;
		}
	}